

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool __thiscall QHttpHeaders::append(QHttpHeaders *this,WellKnownHeader name,QAnyStringView value)

{
  long lVar1;
  QAnyStringView value_00;
  QAnyStringView value_01;
  bool bVar2;
  size_t in_RCX;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_RDX;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffff58;
  WellKnownHeader in_stack_ffffffffffffff5c;
  undefined7 in_stack_ffffffffffffff60;
  undefined1 in_stack_ffffffffffffff67;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value_00.m_size._0_7_ = in_stack_ffffffffffffff88;
  value_00.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)in_RDI;
  value_00.m_size._7_1_ = in_stack_ffffffffffffff8f;
  bVar2 = isValidHttpHeaderValueField(value_00);
  if (bVar2) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)
               CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::operator->
              ((QExplicitlySharedDataPointer<QHttpHeadersPrivate> *)0x1c6d4b);
    HeaderName::HeaderName((HeaderName *)0x1c6d62,in_stack_ffffffffffffff5c);
    value_01.m_size = in_RCX;
    value_01.field_0.m_data = in_RDX.m_data;
    normalizedValue(value_01);
    QList<Header>::push_back
              ((QList<Header> *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60),
               (rvalue_ref)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    Header::~Header((Header *)CONCAT17(in_stack_ffffffffffffff67,in_stack_ffffffffffffff60));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QHttpHeaders::append(WellKnownHeader name, QAnyStringView value)
{
    if (!isValidHttpHeaderValueField(value))
        return false;

    d.detach();
    d->headers.push_back({HeaderName{name}, normalizedValue(value)});
    return true;
}